

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void jessilib::serialize_object
               (ostream *in_stream,object *in_object,string *in_format,text_encoding in_encoding)

{
  element_type *peVar1;
  shared_ptr<jessilib::parser> local_58;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_48;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_38;
  text_encoding local_24;
  string *psStack_20;
  text_encoding in_encoding_local;
  string *in_format_local;
  object *in_object_local;
  ostream *in_stream_local;
  
  local_24 = in_encoding;
  psStack_20 = in_format;
  in_format_local = (string *)in_object;
  in_object_local = (object *)in_stream;
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view(&local_38);
  local_48 = object::
             get<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_nullptr>
                       (in_object,&local_38);
  get_parser((jessilib *)&local_58,psStack_20);
  peVar1 = std::__shared_ptr_access<jessilib::parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<jessilib::parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_58);
  (*peVar1->_vptr_parser[4])(peVar1,in_object_local,in_format_local,(ulong)local_24);
  std::shared_ptr<jessilib::parser>::~shared_ptr(&local_58);
  return;
}

Assistant:

void serialize_object(std::ostream& in_stream, const object& in_object, const std::string& in_format, text_encoding in_encoding) {
	in_object.get<object::string_view_type>(object::string_view_type{});

	get_parser(in_format)->serialize_bytes(in_stream, in_object, in_encoding);
}